

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Get
          (PersistentStorageJson *this,RegistrarId *aId,Network *aRetValue)

{
  Status SVar1;
  string local_40;
  Network *local_20;
  Network *aRetValue_local;
  RegistrarId *aId_local;
  PersistentStorageJson *this_local;
  
  local_20 = aRetValue;
  aRetValue_local = (Network *)aId;
  aId_local = (RegistrarId *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)JSON_NWK_abi_cxx11_);
  SVar1 = GetId<ot::commissioner::persistent_storage::Network,ot::commissioner::persistent_storage::NetworkId>
                    (this,aId,aRetValue,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Get(NetworkId const &aId, Network &aRetValue)
{
    return GetId<Network, NetworkId>(aId, aRetValue, JSON_NWK);
}